

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

void __thiscall
dtc::anon_unknown_1::binary_operator<13,_std::logical_and<unsigned_long_long>_>::binary_operator
          (binary_operator<13,_std::logical_and<unsigned_long_long>_> *this,source_location *l,
          char *o)

{
  source_location local_40;
  char *local_20;
  char *o_local;
  source_location *l_local;
  binary_operator<13,_std::logical_and<unsigned_long_long>_> *this_local;
  
  local_20 = o;
  o_local = (char *)l;
  l_local = (source_location *)this;
  text_input_buffer::source_location::source_location(&local_40,l);
  binary_operator_base::expression(&this->super_binary_operator_base,&local_40);
  text_input_buffer::source_location::~source_location(&local_40);
  (this->super_binary_operator_base).super_expression._vptr_expression =
       (_func_int **)&PTR_operator___001e0b30;
  this->opName = local_20;
  return;
}

Assistant:

binary_operator(source_location l, const char *o) :
		binary_operator_base(l), opName(o) {}